

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall Lexer::Lexer(Lexer *this,string *input)

{
  std::__cxx11::string::string((string *)this,(string *)input);
  (this->m_iter)._M_current = (input->_M_dataplus)._M_p;
  this->m_line = 1;
  return;
}

Assistant:

Lexer::Lexer(const std::string& input)
    : m_input(input)
    , m_iter(input.cbegin())
    , m_line(1)
{

}